

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void print_cpp(duration<double,_std::ratio<1L,_1L>_> t,int n,string_view path,string_view func,
              string_view w,bool b)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  rep rVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  string local_68 [32];
  double local_48;
  double us;
  nanoseconds ns;
  bool b_local;
  int n_local;
  string_view func_local;
  string_view path_local;
  duration<double,_std::ratio<1L,_1L>_> t_local;
  
  path_local._M_len = (size_t)path._M_str;
  ns.__r._3_1_ = b;
  ns.__r._4_4_ = n;
  path_local._M_str = (char *)t.__r;
  us = (double)std::chrono::
               duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,double,std::ratio<1l,1l>>
                         ((duration<double,_std::ratio<1L,_1L>_> *)&path_local._M_str);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&us);
  local_48 = (double)rVar2 / 1000.0;
  fs_backend_abi_cxx11_();
  poVar3 = std::operator<<((ostream *)&std::cout,local_68);
  poVar3 = std::operator<<(poVar3,": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ns.__r._4_4_);
  poVar3 = std::operator<<(poVar3," x ");
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,func);
  poVar3 = std::operator<<((ostream *)pbVar4,"(");
  __str._M_str = (char *)path_local._M_len;
  __str._M_len = path._M_len;
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,__str);
  std::operator<<((ostream *)pbVar4,") = ");
  std::__cxx11::string::~string(local_68);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&w);
  if (bVar1) {
    std::ostream::operator<<((ostream *)&std::cout,(bool)(ns.__r._3_1_ & 1));
  }
  else {
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,w);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_48);
  std::operator<<(poVar3," us\n");
  return;
}

Assistant:

void print_cpp(std::chrono::duration<double> t, int n, std::string_view path, std::string_view func, std::string_view w, bool b)
{
  std::chrono::nanoseconds ns = std::chrono::duration_cast<std::chrono::nanoseconds>(t);
  double us = static_cast<double>(ns.count()) / 1000.0;
  std::cout << fs_backend() << ": " << n << " x " << func << "(" << path << ") = ";
  if(w.empty())
    std::cout << b;
  else
    std::cout << w;
  std::cout << ": " << us << " us\n";
}